

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

int multinomial_coef1(int nfactor,int *factor)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  bVar1 = multicoef_check(nfactor,factor);
  if (bVar1) {
    iVar2 = i4vec_sum(nfactor,factor);
    dVar5 = lgamma((double)(iVar2 + 1));
    uVar4 = 0;
    uVar3 = (ulong)(uint)nfactor;
    if (nfactor < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      dVar6 = lgamma((double)(factor[uVar4] + 1));
      dVar5 = dVar5 - dVar6;
    }
    dVar5 = exp(dVar5);
    iVar2 = r8_nint(dVar5);
    return iVar2;
  }
  std::operator<<((ostream *)&std::cout," \n");
  std::operator<<((ostream *)&std::cout,"MULTINOMIAL_COEF1 - Fatal error!\n");
  std::operator<<((ostream *)&std::cout,"  MULTICOEF_CHECK failed.\n");
  return -0x7fffffff;
}

Assistant:

int multinomial_coef1 ( int nfactor, int factor[] )

//****************************************************************************80
//
//  Purpose:
//
//    MULTINOMIAL_COEF1 computes a Multinomial coefficient.
//
//  Discussion:
//
//    The multinomial coefficient is a generalization of the binomial
//    coefficient.  It may be interpreted as the number of combinations of
//    N objects, where FACTOR(1) objects are indistinguishable of type 1,
//    ... and FACTOR(NFACTOR) are indistinguishable of type NFACTOR,
//    and N is the sum of FACTOR(1) through FACTOR(NFACTOR).
//
//    NCOMB = N! / ( FACTOR(1)! FACTOR(2)! ... FACTOR(NFACTOR)! )
//
//    The log of the gamma function is used, to avoid overflow.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 February 1999
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int NFACTOR, the number of factors.
//    1 <= NFACTOR.
//
//    Input, int FACTOR(NFACTOR), contains the factors.
//    0.0 <= FACTOR(I).
//
//    Output, int MULTINOMIAL_COEF1, the value of the multinomial coefficient.
//
{
  double facn;
  int i;
  int n;
  int ncomb;

  if (  !multicoef_check ( nfactor, factor ) )
  {
    cout << " \n";
    cout << "MULTINOMIAL_COEF1 - Fatal error!\n";
    cout << "  MULTICOEF_CHECK failed.\n";
    ncomb = -i4_huge ( );
    return ncomb;
  }
//
//  The factors sum to N.
//
  n = i4vec_sum ( nfactor, factor );

  facn = lgamma ( static_cast<double>(n + 1 ) );

  for ( i = 0; i < nfactor; i++ )
  {
    facn = facn - lgamma ( static_cast< double >( factor[i] + 1 ) );
  }

  ncomb = r8_nint ( exp ( facn ) );

  return ncomb;
}